

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

void nn_req_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  nn_req *self_00;
  int allow_delay;
  int *piVar1;
  
  self_00 = (nn_req *)&self[-10].stopped.item;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_req *)0x0;
  }
  piVar1 = &self_00->state;
  switch(self_00->state) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_00123c0c:
        *piVar1 = 2;
        return;
      }
      src = type;
      nn_req_handler_cold_20();
      type = extraout_EDX;
      goto switchD_00123b40_caseD_5;
    }
    break;
  case 2:
    if (src == -2) {
      if (type != 4) {
        src = type;
        nn_req_handler_cold_18();
        type = extraout_EDX_01;
        goto switchD_00123b40_caseD_6;
      }
LAB_00123c43:
      allow_delay = 1;
      goto LAB_00123c4b;
    }
    goto LAB_00123cf8;
  case 3:
switchD_00123b40_caseD_3:
    if (src != -2) goto LAB_00123ce9;
    if (type == 4) {
      return;
    }
    if (type == 3) {
      allow_delay = 0;
LAB_00123c4b:
      nn_req_action_send(self_00,allow_delay);
      return;
    }
    goto LAB_00123d11;
  case 4:
    if (src == 1) goto LAB_00123c7c;
    if (src == -2) {
      if (type == 6) goto LAB_00123c85;
      if (type == 4) {
        nn_timer_stop(&(self_00->task).timer);
        (self_00->task).sent_to = (nn_pipe *)0x0;
        self_00->state = 6;
        return;
      }
      if (type == 2) {
        nn_timer_stop(&(self_00->task).timer);
        (self_00->task).sent_to = (nn_pipe *)0x0;
        self_00->state = 7;
        return;
      }
      goto LAB_00123d3b;
    }
    goto LAB_00123d02;
  case 5:
switchD_00123b40_caseD_5:
    if (src != -2) {
      if (src == 1) {
        if (type == 2) goto LAB_00123c43;
        src = type;
        nn_req_handler_cold_10();
        type = extraout_EDX_00;
        goto switchD_00123b40_caseD_3;
      }
      goto LAB_00123cfd;
    }
    if (type == 4) {
LAB_00123cb9:
      *piVar1 = 6;
      return;
    }
    nn_req_handler_cold_9();
    type = extraout_EDX_02;
LAB_00123c7c:
    if (type == 1) {
LAB_00123c85:
      nn_timer_stop(&(self_00->task).timer);
      (self_00->task).sent_to = (nn_pipe *)0x0;
      self_00->state = 5;
      return;
    }
    goto LAB_00123d1f;
  case 6:
switchD_00123b40_caseD_6:
    if (src != -2) {
      if (src != 1) goto LAB_00123d07;
      if (type == 2) goto LAB_00123c43;
      goto LAB_00123d26;
    }
    if (type == 4) {
      return;
    }
    nn_req_handler_cold_6();
    type = extraout_EDX_03;
LAB_00123cb4:
    if (type == 4) goto LAB_00123cb9;
    goto LAB_00123d34;
  case 7:
    if (src == -2) goto LAB_00123cb4;
    if (src != 1) goto LAB_00123d0c;
    if (type == 2) {
      *piVar1 = 8;
      return;
    }
    goto LAB_00123d2d;
  case 8:
    if (src != -2) goto LAB_00123cee;
    if (type == 4) goto LAB_00123c43;
    if (type == 5) goto LAB_00123c0c;
    goto LAB_00123d18;
  default:
    nn_req_handler_cold_21();
LAB_00123ce9:
    nn_req_handler_cold_15();
LAB_00123cee:
    nn_req_handler_cold_1();
  }
  nn_req_handler_cold_19();
LAB_00123cf8:
  nn_req_handler_cold_17();
LAB_00123cfd:
  nn_req_handler_cold_11();
LAB_00123d02:
  nn_req_handler_cold_14();
LAB_00123d07:
  nn_req_handler_cold_8();
LAB_00123d0c:
  nn_req_handler_cold_5();
LAB_00123d11:
  nn_req_handler_cold_16();
LAB_00123d18:
  nn_req_handler_cold_2();
LAB_00123d1f:
  nn_req_handler_cold_12();
LAB_00123d26:
  nn_req_handler_cold_7();
LAB_00123d2d:
  nn_req_handler_cold_4();
LAB_00123d34:
  nn_req_handler_cold_3();
LAB_00123d3b:
  nn_req_handler_cold_13();
}

Assistant:

void nn_req_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, fsm);

    switch (req->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The socket was created recently. Intermediate state.                      */
/*  Pass straight to the PASSIVE state.                                       */
/******************************************************************************/
    case NN_REQ_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                req->state = NN_REQ_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  PASSIVE state.                                                            */
/*  No request is submitted.                                                  */
/******************************************************************************/
    case NN_REQ_STATE_PASSIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                nn_req_action_send (req, 1);
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  DELAYED state.                                                            */
/*  Request was submitted but it could not be sent to the network because     */
/*  there was no peer available at the moment. Now we are waiting for the     */
/*  peer to arrive to send the request to it.                                 */
/******************************************************************************/
    case NN_REQ_STATE_DELAYED:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_OUT:
                nn_req_action_send (req, 0);
                return;
            case NN_REQ_ACTION_SENT:
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Request was submitted. Waiting for reply.                                 */
/******************************************************************************/
    case NN_REQ_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_IN:

                /*  Reply arrived. */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_STOPPING_TIMER;
                return;

            case NN_REQ_ACTION_SENT:

                /*  New request was sent while the old one was still being
                    processed. Cancel the old request first. */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_CANCELLING;
                return;

            case NN_REQ_ACTION_PIPE_RM:
                /*  Pipe that we sent request to is removed  */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                /*  Pretend we timed out so request resent immediately  */
                req->state = NN_REQ_STATE_TIMED_OUT;
                return;

            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_TIMED_OUT;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  TIMED_OUT state.                                                          */
/*  Waiting for reply has timed out. Stopping the timer. Afterwards, we'll    */
/*  re-send the request.                                                      */
/******************************************************************************/
    case NN_REQ_STATE_TIMED_OUT:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_req_action_send (req, 1);
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                req->state = NN_REQ_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  CANCELLING state.                                                         */
/*  Request was canceled. Waiting till the timer is stopped. Note that        */
/*  cancelling is done by sending a new request. Thus there's already         */
/*  a request waiting to be sent in this state.                               */
/******************************************************************************/
    case NN_REQ_STATE_CANCELLING:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:

                /*  Timer is stopped. Now we can send the delayed request. */
                nn_req_action_send (req, 1);
                return;

            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
             switch (type) {
             case NN_REQ_ACTION_SENT:

                 /*  No need to do anything here. Old delayed request is just
                     replaced by the new one that will be sent once the timer
                     is closed. */
                 return;

             default:
                 nn_fsm_bad_action (req->state, src, type);
             }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER state.                                                     */
/*  Reply was delivered. Waiting till the timer is stopped.                   */
/******************************************************************************/
    case NN_REQ_STATE_STOPPING_TIMER:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:

            switch (type) {
            case NN_TIMER_STOPPED:
                req->state = NN_REQ_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                req->state = NN_REQ_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  Reply was received but not yet retrieved by the user.                     */
/******************************************************************************/
    case NN_REQ_STATE_DONE:
        switch (src) {

        case NN_FSM_ACTION:
             switch (type) {
             case NN_REQ_ACTION_RECEIVED:
                 req->state = NN_REQ_STATE_PASSIVE;
                 return;
             case NN_REQ_ACTION_SENT:
                 nn_req_action_send (req, 1);
                 return;
             default:
                 nn_fsm_bad_action (req->state, src, type);
             }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (req->state, src, type);
    }
}